

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O3

XML_Error processXmlDecl(XML_Parser parser,int isGeneralTextEntity,char *s,char *next)

{
  ENCODING *pEVar1;
  long *plVar2;
  char *pcVar3;
  int iVar4;
  XML_Error XVar5;
  code *pcVar6;
  XML_Char *encodingName_00;
  XML_Char *pXVar7;
  long *plVar8;
  long *plVar9;
  bool bVar10;
  int standalone;
  char *encodingName;
  undefined8 *local_50;
  char *version;
  ENCODING *newEncoding;
  char *versionend;
  
  encodingName = (char *)0x0;
  newEncoding = (ENCODING *)0x0;
  version = (char *)0x0;
  standalone = -1;
  if (*(int *)((long)parser + 0x1c8) == 0) {
    pcVar6 = cm_expat_XmlParseXmlDecl;
  }
  else {
    pcVar6 = cm_expat_XmlParseXmlDeclNS;
  }
  local_50 = (undefined8 *)((long)parser + 0x218);
  iVar4 = (*pcVar6)(isGeneralTextEntity,*(undefined8 *)((long)parser + 0x118),s,next,local_50,
                    &version,&versionend,&encodingName,&newEncoding,&standalone);
  pcVar3 = encodingName;
  if (iVar4 == 0) {
    return XML_ERROR_SYNTAX;
  }
  if (((isGeneralTextEntity == 0) && (standalone == 1)) &&
     (*(undefined4 *)((long)parser + 0x364) = 1, *(int *)((long)parser + 0x48c) == 1)) {
    *(undefined4 *)((long)parser + 0x48c) = 0;
  }
  if (*(long *)((long)parser + 0x110) == 0) {
    if (*(long *)((long)parser + 0xa0) != 0) {
      reportDefault(parser,*(ENCODING **)((long)parser + 0x118),s,next);
    }
    encodingName_00 = (XML_Char *)0x0;
    bVar10 = false;
  }
  else {
    if (encodingName == (char *)0x0) {
      encodingName_00 = (XML_Char *)0x0;
    }
    else {
      pEVar1 = *(ENCODING **)((long)parser + 0x118);
      iVar4 = (*pEVar1->nameLength)(pEVar1,encodingName);
      encodingName_00 =
           poolStoreString((STRING_POOL *)((long)parser + 0x448),pEVar1,pcVar3,pcVar3 + iVar4);
      if (encodingName_00 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
      *(undefined8 *)((long)parser + 0x468) = *(undefined8 *)((long)parser + 0x460);
    }
    if (version == (char *)0x0) {
      pXVar7 = (XML_Char *)0x0;
    }
    else {
      pXVar7 = poolStoreString((STRING_POOL *)((long)parser + 0x448),
                               *(ENCODING **)((long)parser + 0x118),version,
                               versionend +
                               -(long)(*(ENCODING **)((long)parser + 0x118))->minBytesPerChar);
      if (pXVar7 == (XML_Char *)0x0) {
        return XML_ERROR_NO_MEMORY;
      }
    }
    (**(code **)((long)parser + 0x110))
              (*(undefined8 *)((long)parser + 8),pXVar7,encodingName_00,standalone);
    bVar10 = pXVar7 != (XML_Char *)0x0;
  }
  pcVar3 = encodingName;
  if (*(long *)((long)parser + 0x1c0) == 0) {
    if (newEncoding == (ENCODING *)0x0) {
      if (encodingName != (char *)0x0) {
        if (encodingName_00 == (XML_Char *)0x0) {
          pEVar1 = *(ENCODING **)((long)parser + 0x118);
          iVar4 = (*pEVar1->nameLength)(pEVar1,encodingName);
          encodingName_00 =
               poolStoreString((STRING_POOL *)((long)parser + 0x448),pEVar1,pcVar3,pcVar3 + iVar4);
          if (encodingName_00 == (XML_Char *)0x0) {
            return XML_ERROR_NO_MEMORY;
          }
        }
        XVar5 = handleUnknownEncoding(parser,encodingName_00);
        plVar9 = *(long **)((long)parser + 0x418);
        if (*(long **)((long)parser + 0x420) != (long *)0x0) {
          plVar2 = plVar9;
          plVar8 = *(long **)((long)parser + 0x420);
          if (plVar9 == (long *)0x0) goto LAB_0014f4f9;
          do {
            plVar9 = plVar2;
            plVar2 = (long *)*plVar9;
            *plVar9 = (long)plVar8;
            plVar8 = plVar9;
          } while (plVar2 != (long *)0x0);
        }
        *(long **)((long)parser + 0x420) = plVar9;
LAB_0014f4f9:
        *(undefined8 *)((long)parser + 0x418) = 0;
        *(undefined8 *)((long)parser + 0x428) = 0;
        *(undefined8 *)((long)parser + 0x430) = 0;
        *(undefined8 *)((long)parser + 0x438) = 0;
        if (XVar5 == XML_ERROR_UNKNOWN_ENCODING) {
          *local_50 = encodingName;
          return XML_ERROR_UNKNOWN_ENCODING;
        }
        return XVar5;
      }
    }
    else {
      if (newEncoding->minBytesPerChar != *(int *)(*(long *)((long)parser + 0x118) + 0x88)) {
        *local_50 = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      *(ENCODING **)((long)parser + 0x118) = newEncoding;
    }
  }
  if ((bool)(encodingName_00 == (XML_Char *)0x0 & (bVar10 ^ 1U))) {
    return XML_ERROR_NONE;
  }
  plVar9 = *(long **)((long)parser + 0x448);
  if (*(long **)((long)parser + 0x450) != (long *)0x0) {
    plVar2 = plVar9;
    plVar8 = *(long **)((long)parser + 0x450);
    if (plVar9 == (long *)0x0) goto LAB_0014f43b;
    do {
      plVar9 = plVar2;
      plVar2 = (long *)*plVar9;
      *plVar9 = (long)plVar8;
      plVar8 = plVar9;
    } while (plVar2 != (long *)0x0);
  }
  *(long **)((long)parser + 0x450) = plVar9;
LAB_0014f43b:
  *(undefined8 *)((long)parser + 0x448) = 0;
  *(undefined8 *)((long)parser + 0x458) = 0;
  *(undefined8 *)((long)parser + 0x460) = 0;
  *(undefined8 *)((long)parser + 0x468) = 0;
  return XML_ERROR_NONE;
}

Assistant:

static enum XML_Error
processXmlDecl(XML_Parser parser, int isGeneralTextEntity,
               const char *s, const char *next)
{
  const char *encodingName = 0;
  const char *storedEncName = 0;
  const ENCODING *newEncoding = 0;
  const char *version = 0;
  const char *versionend;
  const char *storedversion = 0;
  int standalone = -1;
  if (!(ns
        ? XmlParseXmlDeclNS
        : XmlParseXmlDecl)(isGeneralTextEntity,
                           encoding,
                           s,
                           next,
                           &eventPtr,
                           &version,
                           &versionend,
                           &encodingName,
                           &newEncoding,
                           &standalone))
    return XML_ERROR_SYNTAX;
  if (!isGeneralTextEntity && standalone == 1) {
    dtd.standalone = 1;
#ifdef XML_DTD
    if (paramEntityParsing == XML_PARAM_ENTITY_PARSING_UNLESS_STANDALONE)
      paramEntityParsing = XML_PARAM_ENTITY_PARSING_NEVER;
#endif /* XML_DTD */
  }
  if (xmlDeclHandler) {
    if (encodingName) {
      storedEncName = poolStoreString(&temp2Pool,
                                      encoding,
                                      encodingName,
                                      encodingName
                                      + XmlNameLength(encoding, encodingName));
      if (! storedEncName)
        return XML_ERROR_NO_MEMORY;
      poolFinish(&temp2Pool);
    }
    if (version) {
      storedversion = poolStoreString(&temp2Pool,
                                      encoding,
                                      version,
                                      versionend - encoding->minBytesPerChar);
      if (! storedversion)
        return XML_ERROR_NO_MEMORY;
    }
    xmlDeclHandler(handlerArg, storedversion, storedEncName, standalone);
  }
  else if (defaultHandler)
    reportDefault(parser, encoding, s, next);
  if (!protocolEncodingName) {
    if (newEncoding) {
      if (newEncoding->minBytesPerChar != encoding->minBytesPerChar) {
        eventPtr = encodingName;
        return XML_ERROR_INCORRECT_ENCODING;
      }
      encoding = newEncoding;
    }
    else if (encodingName) {
      enum XML_Error result;
      if (! storedEncName) {
        storedEncName = poolStoreString(&temp2Pool,
                                        encoding,
                                        encodingName,
                                        encodingName
                                        + XmlNameLength(encoding, encodingName));
        if (! storedEncName)
          return XML_ERROR_NO_MEMORY;
      }
      result = handleUnknownEncoding(parser, storedEncName);
      poolClear(&tempPool);
      if (result == XML_ERROR_UNKNOWN_ENCODING)
        eventPtr = encodingName;
      return result;
    }
  }

  if (storedEncName || storedversion)
    poolClear(&temp2Pool);

  return XML_ERROR_NONE;
}